

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnImportGlobal
          (BinaryReaderLogging *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  Stream *this_00;
  Enum EVar1;
  char *pcVar2;
  char *pcVar3;
  bool mutable__local;
  Index import_index_local;
  BinaryReaderLogging *this_local;
  char *pcStack_38;
  Type type_local;
  string_view field_name_local;
  string_view module_name_local;
  
  pcStack_38 = field_name.data_;
  this_local._4_4_ = type.enum_;
  WriteIndent(this);
  this_00 = this->stream_;
  pcVar2 = Type::GetName((Type *)((long)&this_local + 4));
  pcVar3 = "false";
  if (mutable_) {
    pcVar3 = "true";
  }
  Stream::Writef(this_00,
                 "OnImportGlobal(import_index: %u, global_index: %u, type: %s, mutable: %s)\n",
                 (ulong)import_index,(ulong)global_index,pcVar2,pcVar3);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x15])
                    (this->reader_,(ulong)import_index,module_name.data_,module_name.size_,
                     pcStack_38,field_name.size_,global_index,this_local._4_4_,(uint)mutable_);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImportGlobal(Index import_index,
                                           string_view module_name,
                                           string_view field_name,
                                           Index global_index,
                                           Type type,
                                           bool mutable_) {
  LOGF("OnImportGlobal(import_index: %" PRIindex ", global_index: %" PRIindex
       ", type: %s, mutable: "
       "%s)\n",
       import_index, global_index, type.GetName(), mutable_ ? "true" : "false");
  return reader_->OnImportGlobal(import_index, module_name, field_name,
                                 global_index, type, mutable_);
}